

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  Parse *pPVar4;
  AutoincInfo *pAVar5;
  ushort uVar6;
  bool local_49;
  undefined1 local_48 [8];
  ReusableSpace x;
  int local_30;
  int n;
  int nArg;
  int nCursor;
  int nMem;
  int nVar;
  sqlite3 *db;
  Parse *pParse_local;
  Vdbe *p_local;
  
  _nMem = p->db;
  nCursor = (int)pParse->nVar;
  n = pParse->nTab;
  local_30 = pParse->nMaxArg;
  nArg = n + pParse->nMem;
  if ((n == 0) && (0 < nArg)) {
    nArg = nArg + 1;
  }
  x.nNeeded = p->nOp * 0x18;
  local_48 = (undefined1  [8])(&p->aOp->opcode + x.nNeeded);
  x.pSpace._0_4_ = pParse->szOpAlloc + p->nOp * -0x18 & 0xfffffff8;
  db = (sqlite3 *)pParse;
  pParse_local = (Parse *)p;
  resolveP2Values(p,&local_30);
  local_49 = false;
  if (*(char *)&db->aDb != '\0') {
    local_49 = *(char *)((long)&db->aDb + 1) != '\0';
  }
  uVar6._0_1_ = pParse_local->eOrconf;
  uVar6._1_1_ = pParse_local->disableTriggers;
  uVar6 = uVar6 & 0xffbf | (ushort)local_49 << 6;
  pParse_local->eOrconf = (char)uVar6;
  pParse_local->disableTriggers = (char)(uVar6 >> 8);
  if ((*(char *)((long)&db->pVtabCtx + 3) != '\0') && (nArg < 10)) {
    nArg = 10;
  }
  uVar1._0_1_ = pParse_local->eOrconf;
  uVar1._1_1_ = pParse_local->disableTriggers;
  pParse_local->eOrconf = (char)(uVar1 & 0xfffe);
  pParse_local->disableTriggers = (char)((uVar1 & 0xfffe) >> 8);
  do {
    x.pSpace._4_4_ = 0;
    pvVar3 = allocSpace((ReusableSpace *)local_48,*(void **)&(pParse_local->constraintName).n,
                        nArg * 0x38);
    *(void **)&(pParse_local->constraintName).n = pvVar3;
    pPVar4 = (Parse *)allocSpace((ReusableSpace *)local_48,pParse_local->pToplevel,nCursor * 0x38);
    pParse_local->pToplevel = pPVar4;
    pvVar3 = allocSpace((ReusableSpace *)local_48,*(void **)&pParse_local->writeMask,local_30 << 3);
    *(void **)&pParse_local->writeMask = pvVar3;
    pAVar5 = (AutoincInfo *)allocSpace((ReusableSpace *)local_48,pParse_local->pAinc,n << 3);
    pParse_local->pAinc = pAVar5;
    if (x.pSpace._4_4_ == 0) break;
    local_48 = (undefined1  [8])sqlite3DbMallocRawNN(_nMem,(long)(int)x.pSpace._4_4_);
    *(undefined1 (*) [8])&pParse_local->aColCache[2].iColumn = local_48;
    x.pSpace._0_4_ = x.pSpace._4_4_;
  } while (_nMem->mallocFailed == '\0');
  pParse_local->pTriggerTab = *(Table **)&db->aFunc;
  (db->aFunc).htsize = 0;
  (db->aFunc).count = 0;
  uVar2._0_1_ = pParse_local->eOrconf;
  uVar2._1_1_ = pParse_local->disableTriggers;
  uVar6 = uVar2 & 0xfff3 | (*(byte *)((long)&db->pVtabCtx + 3) & 3) << 2;
  pParse_local->eOrconf = (char)uVar6;
  pParse_local->disableTriggers = (char)(uVar6 >> 8);
  if (_nMem->mallocFailed == '\0') {
    pParse_local->iRangeReg = n;
    pParse_local->isMultiWrite = (char)(short)nCursor;
    pParse_local->mayAbort = (char)((ushort)(short)nCursor >> 8);
    initMemArray((Mem *)pParse_local->pToplevel,nCursor,_nMem,1);
    pParse_local->nRangeReg = nArg;
    initMemArray(*(Mem **)&(pParse_local->constraintName).n,nArg,_nMem,0x80);
    memset(pParse_local->pAinc,0,(long)n << 3);
  }
  else {
    pParse_local->isMultiWrite = '\0';
    pParse_local->mayAbort = '\0';
    pParse_local->iRangeReg = 0;
    pParse_local->nRangeReg = 0;
  }
  sqlite3VdbeRewind((Vdbe *)pParse_local);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( pParse==p->pParse );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  
  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8(sizeof(Op)*p->nOp);              /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  do {
    x.nNeeded = 0;
    p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
    p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
    p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
    p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    if( x.nNeeded==0 ) break;
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
  }while( !db->mallocFailed );

  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  p->explain = pParse->explain;
  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}